

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt5a.cpp
# Opt level: O0

void __thiscall
crnlib::dxt5_endpoint_optimizer::evaluate_solution
          (dxt5_endpoint_optimizer *this,uint low_endpoint,uint high_endpoint)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  uint *puVar5;
  uchar *puVar6;
  uint uVar7;
  uint in_EDX;
  uint in_ESI;
  long *in_RDI;
  int selector_error;
  uint j;
  uint best_selector;
  uint best_selector_error;
  uint weight;
  uint val;
  uint i;
  uint64 trial_error;
  uint selector_values [8];
  uint block_type;
  vector<unsigned_char> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar8;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_44;
  ulong local_40;
  uint local_38 [9];
  uint local_14;
  uint local_10;
  uint local_c;
  
  local_14 = 0;
  local_10 = in_EDX;
  local_c = in_ESI;
  do {
    uVar7 = 1;
    if ((*(byte *)(*in_RDI + 0x1c) & 1) != 0) {
      uVar7 = 2;
    }
    if (uVar7 <= local_14) {
      return;
    }
    if (local_14 == 0) {
      dxt5_block::get_block_values8(local_38,local_c,local_10);
    }
    else {
      dxt5_block::get_block_values6(local_38,local_c,local_10);
    }
    local_40 = 0;
    local_44 = 0;
    while (uVar8 = local_44,
          uVar2 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 2)), uVar8 < uVar2)
    {
      pbVar4 = vector<unsigned_char>::operator[]((vector<unsigned_char> *)(in_RDI + 2),local_44);
      bVar1 = *pbVar4;
      puVar5 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 4),local_44);
      local_50 = 0xffffffff;
      local_54 = 0;
      for (local_58 = 0; local_58 < 8; local_58 = local_58 + 1) {
        uVar3 = ((uint)bVar1 - local_38[local_58]) * ((uint)bVar1 - local_38[local_58]) * *puVar5;
        uVar7 = local_54;
        if (uVar3 < local_50) {
          local_54 = local_58;
          uVar7 = local_54;
          local_54._0_1_ = (undefined1)local_58;
          local_50 = uVar3;
          if (uVar3 == 0) break;
        }
        local_54 = uVar7;
      }
      in_stack_ffffffffffffff90 = CONCAT13((undefined1)local_54,(int3)in_stack_ffffffffffffff90);
      puVar6 = vector<unsigned_char>::operator[]((vector<unsigned_char> *)(in_RDI + 6),local_44);
      *puVar6 = (uchar)((uint)in_stack_ffffffffffffff90 >> 0x18);
      local_40 = local_50 + local_40;
      if (*(ulong *)(in_RDI[1] + 8) < local_40) break;
      local_44 = local_44 + 1;
    }
    if (local_40 < *(ulong *)(in_RDI[1] + 8)) {
      *(ulong *)(in_RDI[1] + 8) = local_40;
      *(char *)(in_RDI[1] + 0x10) = (char)local_c;
      *(char *)(in_RDI[1] + 0x11) = (char)local_10;
      *(char *)(in_RDI[1] + 0x12) = (char)local_14;
      vector<unsigned_char>::swap
                ((vector<unsigned_char> *)CONCAT44(uVar8,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88);
      if (local_40 == 0) {
        return;
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

void dxt5_endpoint_optimizer::evaluate_solution(uint low_endpoint, uint high_endpoint) {
  for (uint block_type = 0; block_type < (m_pParams->m_use_both_block_types ? 2U : 1U); block_type++) {
    uint selector_values[8];

    if (!block_type)
      dxt5_block::get_block_values8(selector_values, low_endpoint, high_endpoint);
    else
      dxt5_block::get_block_values6(selector_values, low_endpoint, high_endpoint);

    uint64 trial_error = 0;

    for (uint i = 0; i < m_unique_values.size(); i++) {
      const uint val = m_unique_values[i];
      const uint weight = m_unique_value_weights[i];

      uint best_selector_error = UINT_MAX;
      uint best_selector = 0;

      for (uint j = 0; j < 8; j++) {
        int selector_error = val - selector_values[j];
        selector_error = selector_error * selector_error * (int)weight;

        if (static_cast<uint>(selector_error) < best_selector_error) {
          best_selector_error = selector_error;
          best_selector = j;
          if (!best_selector_error)
            break;
        }
      }

      m_trial_selectors[i] = static_cast<uint8>(best_selector);
      trial_error += best_selector_error;

      if (trial_error > m_pResults->m_error)
        break;
    }

    if (trial_error < m_pResults->m_error) {
      m_pResults->m_error = trial_error;
      m_pResults->m_first_endpoint = static_cast<uint8>(low_endpoint);
      m_pResults->m_second_endpoint = static_cast<uint8>(high_endpoint);
      m_pResults->m_block_type = static_cast<uint8>(block_type);
      m_best_selectors.swap(m_trial_selectors);

      if (!trial_error)
        break;
    }
  }
}